

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O2

void __thiscall slang::ast::MethodBuilder::MethodBuilder(MethodBuilder *this,MethodBuilder *other)

{
  this->compilation = other->compilation;
  this->symbol = other->symbol;
  (this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.data_ =
       (pointer)(this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.
                firstElement;
  (this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len = 0;
  (this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.cap = 5;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::
  append_range<slang::SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>_>
            (&(this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
             &other->args);
  (other->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len = 0;
  return;
}

Assistant:

MethodBuilder::MethodBuilder(MethodBuilder&& other) noexcept :
    compilation(other.compilation), symbol(other.symbol) {
    // Clear arguments in the other builder so that its destructor doesn't overwrite
    // any arguments we may add from here on out.
    args.append_range(other.args);
    other.args.clear();
}